

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Material>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Material *material
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __lhs;
  uint uVar1;
  string *this;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *this_00;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  string *psVar8;
  int iVar9;
  allocator local_309;
  string *local_308;
  Property *local_300;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2f8;
  string *local_2f0;
  ParseResult ret;
  string local_2b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_298;
  TypedConnection<tinyusdz::Token> *local_290;
  TypedConnection<tinyusdz::Token> *local_288;
  TypedConnection<tinyusdz::Token> *local_280;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ostringstream ss_e;
  _Any_data local_b0;
  code *local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  local_280 = &material->surface;
  local_288 = &material->displacement;
  local_290 = &material->volume;
  local_298 = &(material->super_UsdShadePrim).props;
  local_2f8 = &(material->super_UsdShadePrim).purpose;
  local_308 = err;
  local_2f0 = warn;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var6 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var7;
      p_Var6 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
    __lhs = p_Var6 + 1;
    ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
    psVar8 = (string *)&ss_e;
    ::std::__cxx11::string::string((string *)psVar8,"outputs:surface",(allocator *)&local_2b8);
    local_300 = (Property *)(p_Var6 + 2);
    anon_unknown_0::ParseShaderInputConnectionProperty
              (&ret,&table,&local_50,(Property *)(p_Var6 + 2),psVar8,local_280);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar9 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      bVar2 = false;
      iVar9 = 3;
    }
    else {
      bVar2 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1314);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_248,"Parsing shader property `{}` failed. Error: {}",&local_309)
        ;
        fmt::format<char[16],std::__cxx11::string>
                  (&local_2b8,(fmt *)&local_248,(string *)"outputs:surface",(char (*) [16])&ret.err,
                   psVar8);
        poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2b8);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar8 = local_308;
        if (local_308 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8,&local_248,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar8);
          ::std::__cxx11::string::operator=((string *)psVar8,(string *)&local_2b8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar2 = false;
        iVar9 = 1;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
      psVar8 = (string *)&ss_e;
      ::std::__cxx11::string::string
                ((string *)psVar8,"outputs:displacement",(allocator *)&local_2b8);
      anon_unknown_0::ParseShaderInputConnectionProperty
                (&ret,&table,&local_70,local_300,psVar8,local_288);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar9 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar9 = 3;
LAB_001e586f:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1316);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_248,"Parsing shader property `{}` failed. Error: {}",
                     &local_309);
          fmt::format<char[21],std::__cxx11::string>
                    (&local_2b8,(fmt *)&local_248,(string *)"outputs:displacement",
                     (char (*) [21])&ret.err,psVar8);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2b8);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar8 = local_308;
          if (local_308 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2b8,&local_248,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar8);
            ::std::__cxx11::string::operator=((string *)psVar8,(string *)&local_2b8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar9 = 1;
          goto LAB_001e586f;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar2) goto LAB_001e5ed9;
      ::std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
      psVar8 = (string *)&ss_e;
      ::std::__cxx11::string::string((string *)psVar8,"outputs:volume",(allocator *)&local_2b8);
      anon_unknown_0::ParseShaderInputConnectionProperty
                (&ret,&table,&local_90,local_300,psVar8,local_290);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar9 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar9 = 3;
LAB_001e5a3c:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1318);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_248,"Parsing shader property `{}` failed. Error: {}",
                     &local_309);
          fmt::format<char[15],std::__cxx11::string>
                    (&local_2b8,(fmt *)&local_248,(string *)"outputs:volume",(char (*) [15])&ret.err
                     ,psVar8);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_2b8);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar8 = local_308;
          if (local_308 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2b8,&local_248,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar8);
            ::std::__cxx11::string::operator=((string *)psVar8,(string *)&local_2b8);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar9 = 1;
          goto LAB_001e5a3c;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar2) goto LAB_001e5ed9;
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"purpose");
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
        sVar5 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (sVar5 == 0) {
          Property::value_type_name_abi_cxx11_((string *)&ss_e,local_300);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var3 = ::std::operator==((string *)&ss_e,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ret);
          if ((_Var3) && (uVar1 = *(uint *)((long)&p_Var6[0x17]._M_parent + 4), uVar1 < 2)) {
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar8 = local_308;
            if (uVar1 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar4 = ::std::operator<<(poVar4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar4 = ::std::operator<<(poVar4,":");
              poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
              poVar4 = ::std::operator<<(poVar4,"():");
              poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x131a);
              ::std::operator<<(poVar4," ");
              poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
              poVar4 = ::std::operator<<(poVar4,"purpose");
              poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
              ::std::operator<<(poVar4,"\n");
              this = local_2f0;
              if (local_2f0 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_2b8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar8);
                ::std::__cxx11::string::operator=((string *)this,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              AttrMetas::operator=(&local_2f8->_metas,(AttrMetas *)(p_Var6 + 7));
              ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e)
              ;
              ::std::__cxx11::string::_M_dispose();
              goto LAB_001e5ee4;
            }
          }
          else {
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          psVar8 = local_308;
          _ss_e = PurposeEnumHandler;
          ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_2b8);
          bVar2 = options->strict_allowedToken_check;
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_b0,
                     (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&ss_e);
          bVar2 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                            ((string *)&ret,bVar2,(EnumHandlerFun<tinyusdz::Purpose> *)&local_b0,
                             &local_300->_attrib,local_2f8,local_2f0,psVar8);
          if (local_a0 != (code *)0x0) {
            (*local_a0)(&local_b0,&local_b0,__destroy_functor);
          }
          ::std::__cxx11::string::_M_dispose();
          iVar9 = 1;
          if (bVar2) {
            AttrMetas::operator=(&local_2f8->_metas,(AttrMetas *)(p_Var6 + 7));
            ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_2b8);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&table,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
            ::std::__cxx11::string::_M_dispose();
            iVar9 = 3;
          }
          ::std::
          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::_M_manager((_Any_data *)&ss_e,(_Any_data *)&ss_e,__destroy_functor);
          goto LAB_001e5ed9;
        }
      }
      else {
        sVar5 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)__lhs);
        if (sVar5 == 0) {
          this_00 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_298,(key_type *)__lhs);
          Property::operator=(this_00,local_300);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
        }
        sVar5 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)__lhs);
        if (sVar5 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x131c);
          ::std::operator<<(poVar4," ");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __lhs);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          psVar8 = local_2f0;
          if (local_2f0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_2b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_308);
            ::std::__cxx11::string::operator=((string *)psVar8,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        }
      }
    }
    else {
LAB_001e5ed9:
      if ((iVar9 != 3) && (iVar9 != 0)) break;
    }
LAB_001e5ee4:
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return (_Rb_tree_header *)p_Var6 == p_Var7;
}

Assistant:

bool ReconstructPrim<Material>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Material *material,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;

  // TODO: special treatment for properties with 'inputs' and 'outputs' namespace.

  // For `Material`, `outputs` are terminal attribute and treated as input attribute with connection(Should be "token output:surface.connect = </path/to/shader>").
  for (auto &prop : properties) {
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:surface",
                                  Material, material->surface)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:displacement",
                                  Material, material->displacement)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:volume",
                                  Material, material->volume)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, Material,
                       material->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, Material, material->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}